

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_timer.cpp
# Opt level: O0

void kokkosp_pop_profile_region(void)

{
  KokkosTools::KernelTimer::kokkosp_pop_profile_region();
  return;
}

Assistant:

void kokkosp_pop_profile_region() {
  current_region_level--;

  // current_region_level is out of bounds, inform the user they
  // called popRegion too many times.
  if (current_region_level < 0) {
    current_region_level = 0;
    std::cerr << "WARNING:: Kokkos::Profiling::popRegion() called outside "
              << " of an actve region. Previous regions: ";

    /* This code block will walk back through the non-null regions
     * pointers and print the names.  This takes advantage of a slight
     * issue with regions logic: we never actually delete the
     * KernelPerformanceInfo objects.  If that ever changes this needs
     * to be updated.
     */
    for (int i = 0; i < 5; i++) {
      if (regions[i] != 0) {
        std::cerr << (i == 0 ? " " : ";") << regions[i]->getName();
      } else {
        break;
      }
    }
    std::cerr << "\n";
  } else {
    // don't call addFromTimer if we are outside an active region
    regions[current_region_level]->addFromTimer();
  }
}